

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  pointer pbVar1;
  _func_int **__n1;
  cmCTest *this_00;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  bool bVar5;
  pointer fileOrDir;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string dir;
  string packageGlob;
  Glob gl;
  ostringstream cmCTestLog_msg;
  string local_268;
  string *local_248;
  long *local_240;
  long local_230 [2];
  string local_220;
  Glob local_200;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined8 local_190;
  size_type *local_188;
  undefined8 local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  local_1a8._8_8_ = (baseDir->_M_dataplus)._M_p;
  local_1a8._0_8_ = baseDir->_M_string_length;
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_200.Relative._M_dataplus._M_p = (pointer)&local_200.Relative._M_string_length;
  local_200.Internals = (GlobInternals *)0x0;
  local_200.Recurse = true;
  local_200._9_7_ = 0;
  local_200.Relative._M_string_length._0_1_ = 0x2f;
  local_190 = 1;
  local_180 = 0;
  local_170 = (fileName->_M_dataplus)._M_p;
  local_178 = fileName->_M_string_length;
  local_168 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_1a8;
  local_188 = (size_type *)local_200.Relative._M_dataplus._M_p;
  cmCatViews(&local_220,views);
  cmsys::Glob::Glob(&local_200);
  local_200.Recurse = true;
  local_200.RecurseThroughSymlinks = true;
  cmsys::Glob::FindFiles(&local_200,&local_220,(GlobMessages *)0x0);
  pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&local_200);
  fileOrDir = (pvVar3->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (fileOrDir != pbVar1) {
    local_248 = fileName;
    do {
      cmsys::SystemTools::GetParentDirectory(&local_268,fileOrDir);
      __n1 = (_func_int **)(this->PackageName)._M_string_length;
      local_1a8._0_8_ = local_268._M_string_length;
      local_1a8._8_8_ = local_268._M_dataplus._M_p;
      if ((__n1 <= local_268._M_string_length) &&
         (__str._M_str = (this->PackageName)._M_dataplus._M_p, __str._M_len = (size_t)__n1,
         iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,
                            local_268._M_string_length - (long)__n1,(size_type)__n1,__str),
         iVar2 == 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Found package directory for ",0x1c);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(local_248->_M_dataplus)._M_p,
                            local_248->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_268._M_dataplus._M_p,local_268._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        this_00 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,(char *)local_240,this->Coverage->Quiet);
        if (local_240 != local_230) {
          operator_delete(local_240,local_230[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::string::_M_assign((string *)&this->PackagePath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        bVar5 = true;
        goto LAB_001fb297;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      fileOrDir = fileOrDir + 1;
    } while (fileOrDir != pbVar1);
  }
  bVar5 = false;
LAB_001fb297:
  cmsys::Glob::~Glob(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = cmStrCat(baseDir, '/', fileName);
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmHasSuffix(dir, this->PackageName)) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }